

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
* __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
::child(btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
        *this,int i)

{
  CopyConst<const_char,_ElementType<3UL>_> *ppbVar1;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                  ,0x1e1,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (this[0xb] ==
      (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
       )0x0) {
    local_28 = 1;
    local_20 = 4;
    local_18 = 0x14;
    local_10 = 0x15;
    ppbVar1 = absl::container_internal::internal_layout::
              LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>*,unsigned_char,absl::container_internal::slot_type<S2BooleanOperation::SourceId,int>,gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
              ::Pointer<3ul,char_const>
                        ((LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>*,unsigned_char,absl::container_internal::slot_type<S2BooleanOperation::SourceId,int>,gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,int,std::less<S2BooleanOperation::SourceId>,std::allocator<std::pair<S2BooleanOperation::SourceId_const,int>>,256,false>>*>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,absl::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
                          *)&local_28,(char *)this);
    return (btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
            *)ppbVar1[i];
  }
  __assert_fail("N < 3 || !leaf()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x222,
                "const typename layout_type::template ElementType<N> *gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>>::GetField() const [Params = gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>, N = 3L]"
               );
}

Assistant:

btree_node *child(int i) const { return GetField<3>()[i]; }